

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O2

void __thiscall duckdb::BaseStatistics::Set(BaseStatistics *this,StatsInfo info)

{
  InternalException *this_00;
  undefined7 in_register_00000031;
  allocator local_39;
  string local_38;
  
  switch(CONCAT71(in_register_00000031,info) & 0xffffffff) {
  case 0:
    SetHasNull(this);
    return;
  case 1:
    this->has_null = false;
    break;
  case 3:
    this->has_no_null = false;
    break;
  case 4:
    SetHasNull(this);
  case 2:
    SetHasNoNull(this);
    return;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unrecognized StatsInfo for BaseStatistics::Set",&local_39);
    InternalException::InternalException(this_00,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void BaseStatistics::Set(StatsInfo info) {
	switch (info) {
	case StatsInfo::CAN_HAVE_NULL_VALUES:
		SetHasNull();
		break;
	case StatsInfo::CANNOT_HAVE_NULL_VALUES:
		has_null = false;
		break;
	case StatsInfo::CAN_HAVE_VALID_VALUES:
		SetHasNoNull();
		break;
	case StatsInfo::CANNOT_HAVE_VALID_VALUES:
		has_no_null = false;
		break;
	case StatsInfo::CAN_HAVE_NULL_AND_VALID_VALUES:
		SetHasNull();
		SetHasNoNull();
		break;
	default:
		throw InternalException("Unrecognized StatsInfo for BaseStatistics::Set");
	}
}